

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_channel_map_is_equal
                    (ma_channel *pChannelMapA,ma_channel *pChannelMapB,ma_uint32 channels)

{
  ma_channel mVar1;
  ma_channel mVar2;
  ma_bool32 mVar3;
  ma_uint32 channelIndex;
  
  mVar3 = 1;
  if (pChannelMapA != pChannelMapB) {
    channelIndex = 0;
    do {
      if (channels == channelIndex) {
        return 1;
      }
      mVar1 = ma_channel_map_get_channel(pChannelMapA,channels,channelIndex);
      mVar2 = ma_channel_map_get_channel(pChannelMapB,channels,channelIndex);
      channelIndex = channelIndex + 1;
    } while (mVar1 == mVar2);
    mVar3 = 0;
  }
  return mVar3;
}

Assistant:

MA_API ma_bool32 ma_channel_map_is_equal(const ma_channel* pChannelMapA, const ma_channel* pChannelMapB, ma_uint32 channels)
{
    ma_uint32 iChannel;

    if (pChannelMapA == pChannelMapB) {
        return MA_TRUE;
    }

    for (iChannel = 0; iChannel < channels; ++iChannel) {
        if (ma_channel_map_get_channel(pChannelMapA, channels, iChannel) != ma_channel_map_get_channel(pChannelMapB, channels, iChannel)) {
            return MA_FALSE;
        }
    }

    return MA_TRUE;
}